

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void err_info_about_objects(char *func,QObject *sender,QObject *receiver)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  QMessageLogger *this;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QString b;
  QString a;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_fffffffffffffeb8;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  QMessageLogger *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  QObject *in_stack_fffffffffffffef8;
  QMessageLogger local_b0;
  QMessageLogger local_78;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    QString::QString((QString *)0x3f1b3d);
  }
  else {
    QObject::objectName(in_stack_fffffffffffffef8);
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_RDX == 0) {
    QString::QString((QString *)0x3f1b95);
  }
  else {
    QObject::objectName(in_stack_fffffffffffffef8);
  }
  bVar1 = QString::isEmpty((QString *)0x3f1ba2);
  if (!bVar1) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcConnect();
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f1c08);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(char *)in_stack_fffffffffffffeb8,
                 (char *)0x3f1c28);
      QString::toLocal8Bit((QString *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8))
      ;
      pcVar3 = QByteArray::data((QByteArray *)in_stack_fffffffffffffec0);
      QMessageLogger::warning(&local_78,"QObject::%s:  (sender name:   \'%s\')",in_RDI,pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x3f1c8e);
      puStack_10 = (undefined1 *)((ulong)puStack_10 & 0xffffffffffffff00);
    }
  }
  bVar1 = QString::isEmpty((QString *)0x3f1cfc);
  if (!bVar1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    lcConnect();
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    while (uVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), (bool)uVar2) {
      this = (QMessageLogger *)
             anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                       ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f1d62);
      QMessageLogger::QMessageLogger
                (this,in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                 (char *)in_stack_fffffffffffffeb8,(char *)0x3f1d82);
      in_stack_fffffffffffffec8 = in_RDI;
      QString::toLocal8Bit((QString *)CONCAT17(uVar2,in_stack_fffffffffffffed8));
      in_stack_fffffffffffffec0 =
           (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
           QByteArray::data((QByteArray *)in_stack_fffffffffffffec0);
      QMessageLogger::warning
                (&local_b0,"QObject::%s:  (receiver name: \'%s\')",in_stack_fffffffffffffec8,
                 in_stack_fffffffffffffec0);
      QByteArray::~QByteArray((QByteArray *)0x3f1de8);
      puStack_20 = (undefined1 *)((ulong)puStack_20 & 0xffffffffffffff00);
    }
  }
  QString::~QString((QString *)0x3f1e25);
  QString::~QString((QString *)0x3f1e32);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_DECL_COLD_FUNCTION
static void err_info_about_objects(const char *func, const QObject *sender, const QObject *receiver)
{
    QString a = sender ? sender->objectName() : QString();
    QString b = receiver ? receiver->objectName() : QString();
    if (!a.isEmpty())
        qCWarning(lcConnect, "QObject::%s:  (sender name:   '%s')", func, a.toLocal8Bit().data());
    if (!b.isEmpty())
        qCWarning(lcConnect, "QObject::%s:  (receiver name: '%s')", func, b.toLocal8Bit().data());
}